

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O2

Card ** game_deckCreate(unsigned_long *cardsCount)

{
  Card **cards;
  unsigned_long uVar1;
  
  cards = cards_createDeck((gConfig.game)->numDecks);
  uVar1 = (ulong)(gConfig.game)->numDecks * 0x34;
  *cardsCount = uVar1;
  cards_shuffle(cards,(uchar)uVar1);
  return cards;
}

Assistant:

Card ** game_deckCreate(unsigned long * cardsCount)
{
	Card ** cards = cards_createDeck(gConfig.game->numDecks);
	*cardsCount = (gConfig.game->numDecks*52);

	cards_shuffle(cards, *cardsCount);

	return cards;
}